

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::FeatureVectorizer::FeatureVectorizer(FeatureVectorizer *this)

{
  FeatureVectorizer *pFVar1;
  FeatureVectorizer *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FeatureVectorizer_00624d10;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureVectorizer_InputColumn>::
  RepeatedPtrField(&this->inputlist_);
  pFVar1 = internal_default_instance();
  if (this != pFVar1) {
    protobuf_FeatureVectorizer_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

FeatureVectorizer::FeatureVectorizer()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_FeatureVectorizer_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.FeatureVectorizer)
}